

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O2

void __thiscall
JsonArray_BeginArrayReturnsError_Test::TestBody(JsonArray_BeginArrayReturnsError_Test *this)

{
  error_category *peVar1;
  TypedExpectation<std::error_code_()> *this_00;
  extensions extensions;
  mock_json_callbacks *in_RSI;
  char *pcVar2;
  error_code value;
  coord local_108;
  coord local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  AssertionResult gtest_ar;
  error_code error;
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  
  peVar1 = (error_category *)std::_V2::generic_category();
  error._M_value = 5;
  error._M_cat = peVar1;
  gtest_ar._0_8_ =
       mock_json_callbacks::gmock_begin_array
                 ((MockSpec<std::error_code_()> *)&(this->super_JsonArray).callbacks_,in_RSI);
  testing::internal::GetWithoutMatchers();
  extensions = 0x16d83b;
  this_00 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                      ((MockSpec<std::error_code_()> *)&gtest_ar,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
                       ,0x37,"callbacks_","begin_array ()");
  value._M_cat = peVar1;
  value._0_8_ = 5;
  testing::internal::ReturnAction<std::error_code>::ReturnAction
            ((ReturnAction<std::error_code> *)&local_100,value);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<std::error_code_()> *)&p,(ReturnAction *)&local_100);
  testing::internal::TypedExpectation<std::error_code_()>::WillOnce
            (this_00,(Action<std::error_code_()> *)&p);
  std::_Function_base::~_Function_base((_Function_base *)&p);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8);
  pstore::json::make_parser<callbacks_proxy<mock_json_callbacks>>
            (&p,(json *)&(this->super_JsonArray).proxy_,(callbacks_proxy<mock_json_callbacks> *)0x0,
             extensions);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
               "[\n]\n",4);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input(&p,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&gtest_ar,"p.last_error ()","error",&p.error_,&error);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if (local_100 != (coord)0x0) {
      (**(code **)(*(long *)local_100 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_100 = p.coordinate_;
  local_108.column = 1;
  local_108.row = 1;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)&gtest_ar,"p.coordinate ()","(json::coord{1U, 1U})",&local_100,&local_108);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if (local_100 != (coord)0x0) {
      (**(code **)(*(long *)local_100 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser(&p);
  return;
}

Assistant:

TEST_F (JsonArray, BeginArrayReturnsError) {
    std::error_code const error = make_error_code (std::errc::io_error);
    using ::testing::Return;
    EXPECT_CALL (callbacks_, begin_array ()).WillOnce (Return (error));

    auto p = json::make_parser (proxy_);
    p.input ("[\n]\n"s);
    EXPECT_EQ (p.last_error (), error);
    EXPECT_EQ (p.coordinate (), (json::coord{1U, 1U}));
}